

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::widgets::select::render_input(select *this,form_context *context)

{
  ostream *out;
  ostream *poVar1;
  pointer peVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  escape local_78;
  streamable local_50;
  
  base_widget::auto_generate((base_widget *)this,context);
  out = form_context::out(context);
  if (context->widget_part_type_ != 0) {
    std::operator<<(out," >\n");
    uVar4 = 0;
    while( true ) {
      uVar5 = (ulong)uVar4;
      peVar2 = (this->super_select_base).elements_.
               super__Vector_base<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->super_select_base).elements_.
                         super__Vector_base<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)peVar2) / 0xd0) <= uVar5
         ) break;
      poVar1 = std::operator<<(out,"<option value=\"");
      util::escape((string *)&local_78,&peVar2[uVar5].id);
      poVar1 = std::operator<<(poVar1,(string *)&local_78);
      std::operator<<(poVar1,"\" ");
      std::__cxx11::string::~string((string *)&local_78);
      if (uVar4 == (this->super_select_base).selected_) {
        pcVar3 = "selected ";
        if (context->html_type_ == 1) {
          pcVar3 = "selected=\"selected\" ";
        }
        std::operator<<(out,pcVar3);
      }
      peVar2 = peVar2 + uVar5;
      std::operator<<(out,">");
      if ((undefined1  [208])((undefined1  [208])*peVar2 & (undefined1  [208])0x1) ==
          (undefined1  [208])0x0) {
        util::escape((string *)&local_78,&peVar2->str_option);
        std::operator<<(out,(string *)&local_78);
        std::__cxx11::string::~string((string *)&local_78);
      }
      else {
        filters::streamable::streamable<booster::locale::basic_message<char>>
                  (&local_50,&peVar2->tr_option);
        filters::escape::escape(&local_78,&local_50);
        filters::escape::operator()(&local_78,out);
        filters::escape::~escape(&local_78);
        filters::streamable::~streamable(&local_50);
      }
      std::operator<<(out,"</option>\n");
      uVar4 = uVar4 + 1;
    }
    std::operator<<(out,"</select>");
    return;
  }
  std::operator<<(out,"<select ");
  (*(this->super_select_base).super_base_widget.super_base_form._vptr_base_form[9])(this,context);
  return;
}

Assistant:

void select::render_input(form_context &context)
{
	auto_generate(&context);
	std::ostream &out=context.out();
	if(context.widget_part() == first_part) {
		out<<"<select ";
		render_attributes(context);
	}
	else {
		out<<" >\n";
		for(unsigned i=0;i<elements_.size();i++) {
			element &el=elements_[i];
			out << "<option value=\"" << util::escape(el.id) <<"\" ";
			if(int(i) == selected()) {
				if(context.html() == as_xhtml)
					out << "selected=\"selected\" ";
				else
					out << "selected ";
			}
			out << ">";
			if(el.need_translation)
				out << filters::escape(el.tr_option);
			else
				out << util::escape(el.str_option);
			out << "</option>\n";
		}
		out << "</select>";
	}
}